

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsAttributeLocationTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::AttributeLocationTestUtil::Attribute::Attribute
          (Attribute *this,AttribType *type,string *name,deInt32 layoutLocation,Cond *cond,
          int arraySize)

{
  pointer pcVar1;
  deUint32 dVar2;
  
  (this->m_type).m_name._M_dataplus._M_p = (pointer)&(this->m_type).m_name.field_2;
  pcVar1 = (type->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (type->m_name)._M_string_length);
  dVar2 = type->m_glTypeEnum;
  (this->m_type).m_locationSize = type->m_locationSize;
  (this->m_type).m_glTypeEnum = dVar2;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar1,pcVar1 + name->_M_string_length);
  this->m_layoutLocation = layoutLocation;
  (this->m_cond).m_negate = cond->m_negate;
  (this->m_cond).m_name._M_dataplus._M_p = (pointer)&(this->m_cond).m_name.field_2;
  pcVar1 = (cond->m_name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->m_cond).m_name,pcVar1,pcVar1 + (cond->m_name)._M_string_length);
  this->m_arraySize = arraySize;
  return;
}

Assistant:

Attribute::Attribute (const AttribType& type, const string& name, deInt32 layoutLocation, const Cond& cond, int arraySize)
	: m_type			(type)
	, m_name			(name)
	, m_layoutLocation	(layoutLocation)
	, m_cond			(cond)
	, m_arraySize		(arraySize)
{
}